

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O3

vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *
getSlicingCriteriaValues
          (vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *__return_storage_ptr__
          ,Module *M,string *slicingCriteria,string *legacySlicingCriteria,
          string *legacySecondaryCriteria,bool criteria_are_next_instr)

{
  pointer pSVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  long *plVar5;
  raw_ostream *prVar6;
  long lVar7;
  undefined7 in_register_00000089;
  pointer opt;
  _Rb_tree_header *p_Var8;
  pointer pSVar9;
  StringRef Str;
  StringRef Str_00;
  vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> C;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string criteria;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  legacyCriteriaParts;
  undefined1 local_e0 [24];
  long lStack_c8;
  undefined4 local_bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Module *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  string *local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar2 = (slicingCriteria->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + slicingCriteria->_M_string_length);
  iVar4 = std::__cxx11::string::compare((char *)legacySlicingCriteria);
  if (iVar4 != 0) {
    local_bc = (undefined4)CONCAT71(in_register_00000089,criteria_are_next_instr);
    local_98 = M;
    splitList(&local_48,legacySlicingCriteria,',');
    local_88 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pSVar9 = (pointer)(local_e0 + 0x10);
      opt = local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_90 = legacySecondaryCriteria;
      do {
        iVar4 = std::__cxx11::string::compare((char *)&local_68);
        if (iVar4 != 0) {
          std::__cxx11::string::append((char *)&local_68);
        }
        splitList(&local_80,opt,':');
        lVar7 = (long)local_80.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_80.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (lVar7 == 1) {
          pcVar2 = (opt->_M_dataplus)._M_p;
          local_e0._0_8_ = pSVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_e0,pcVar2,pcVar2 + opt->_M_string_length);
          std::__cxx11::string::append((char *)local_e0);
          std::__cxx11::string::_M_append((char *)&local_68,local_e0._0_8_);
          legacySecondaryCriteria = local_90;
          if ((pointer)local_e0._0_8_ != pSVar9) {
            operator_delete((void *)local_e0._0_8_,
                            (ulong)&(((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                                       *)local_e0._16_8_)->_M_t)._M_impl.field_0x1);
            legacySecondaryCriteria = local_90;
          }
        }
        else {
          if (lVar7 != 2) {
            prVar6 = (raw_ostream *)llvm::errs();
            Str.Length = 0x16;
            Str.Data = "Unsupported criteria: ";
            prVar6 = llvm::raw_ostream::operator<<(prVar6,Str);
            prVar6 = (raw_ostream *)
                     llvm::raw_ostream::write((char *)prVar6,(ulong)(opt->_M_dataplus)._M_p);
            Str_00.Length = 1;
            Str_00.Data = "\n";
            llvm::raw_ostream::operator<<(prVar6,Str_00);
            (__return_storage_ptr__->
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (__return_storage_ptr__->
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (__return_storage_ptr__->
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_80);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_48);
            goto LAB_00126601;
          }
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          pcVar2 = ((local_80.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,pcVar2,
                     pcVar2 + (local_80.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
          std::__cxx11::string::append((char *)&local_b8);
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_b8,
                                      (ulong)local_80.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].
                                             _M_dataplus._M_p);
          pSVar1 = (pointer)(plVar5 + 2);
          if ((pointer)*plVar5 == pSVar1) {
            local_e0._16_8_ = *(undefined8 *)&(pSVar1->primary)._M_t._M_impl;
            lStack_c8 = plVar5[3];
            local_e0._0_8_ = pSVar9;
          }
          else {
            local_e0._16_8_ = *(undefined8 *)&(pSVar1->primary)._M_t._M_impl;
            local_e0._0_8_ = (pointer)*plVar5;
          }
          local_e0._8_8_ = plVar5[1];
          *plVar5 = (long)pSVar1;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_68,local_e0._0_8_);
          if ((pointer)local_e0._0_8_ != pSVar9) {
            operator_delete((void *)local_e0._0_8_,
                            (ulong)&(((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                                       *)local_e0._16_8_)->_M_t)._M_impl.field_0x1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        iVar4 = std::__cxx11::string::compare((char *)legacySecondaryCriteria);
        if (iVar4 != 0) {
          std::operator+(&local_b8,"|",legacySecondaryCriteria);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
          pSVar1 = (pointer)(plVar5 + 2);
          if ((pointer)*plVar5 == pSVar1) {
            local_e0._16_8_ = *(undefined8 *)&(pSVar1->primary)._M_t._M_impl;
            lStack_c8 = plVar5[3];
            local_e0._0_8_ = pSVar9;
          }
          else {
            local_e0._16_8_ = *(undefined8 *)&(pSVar1->primary)._M_t._M_impl;
            local_e0._0_8_ = (pointer)*plVar5;
          }
          local_e0._8_8_ = plVar5[1];
          *plVar5 = (long)pSVar1;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_68,local_e0._0_8_);
          if ((pointer)local_e0._0_8_ != pSVar9) {
            operator_delete((void *)local_e0._0_8_,
                            (ulong)&(((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                                       *)local_e0._16_8_)->_M_t)._M_impl.field_0x1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_80);
        opt = opt + 1;
      } while (opt != local_88);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    criteria_are_next_instr = SUB41(local_bc,0);
    M = local_98;
  }
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getSlicingCriteriaInstructions
            ((vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *)local_e0,M,&local_68
             ,criteria_are_next_instr,(LLVMPointerAnalysis *)0x0,false);
  uVar3 = local_e0._8_8_;
  if (local_e0._0_8_ != local_e0._8_8_) {
    p_Var8 = &(((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                 *)(local_e0._0_8_ + 0x30))->_M_t)._M_impl.super__Rb_tree_header;
    do {
      std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
      _M_range_insert<std::_Rb_tree_const_iterator<llvm::Value_const*>>
                ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)((long)(p_Var8 + -1) + 8),
                 (long)(p_Var8 + -2) + 0x20);
      std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
      _M_range_insert<std::_Rb_tree_const_iterator<llvm::Value_const*>>
                ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish,(p_Var8->_M_header)._M_left,p_Var8);
      pSVar9 = (pointer)(p_Var8 + 1);
      p_Var8 = (_Rb_tree_header *)((long)(p_Var8 + 2) + 0x10);
    } while (pSVar9 != (pointer)uVar3);
  }
  std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>::~vector
            ((vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *)local_e0);
LAB_00126601:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const llvm::Value *>
getSlicingCriteriaValues(llvm::Module &M, const std::string &slicingCriteria,
                         const std::string &legacySlicingCriteria,
                         const std::string &legacySecondaryCriteria,
                         bool criteria_are_next_instr) {
    std::string criteria = slicingCriteria;
    if (legacySlicingCriteria != "") {
        auto legacyCriteriaParts = splitList(legacySlicingCriteria, ',');
        for (auto &legacyCriterion : legacyCriteriaParts) {
            if (criteria != "")
                criteria += ";";

            auto parts = splitList(legacyCriterion, ':');
            if (parts.size() == 2) {
                criteria += parts[0] + "#" + parts[1];
            } else if (parts.size() == 1) {
                criteria += legacyCriterion + "()";
            } else {
                llvm::errs()
                        << "Unsupported criteria: " << legacyCriterion << "\n";
                return {};
            }
            if (legacySecondaryCriteria != "") {
                criteria += "|" + legacySecondaryCriteria + "()";
            }
        }
    }

    std::vector<const llvm::Value *> ret;
    auto C = getSlicingCriteriaInstructions(
            M, criteria, criteria_are_next_instr,
            /*pta = */ nullptr, /* constructed only */ false);
    for (auto &critset : C) {
        ret.insert(ret.end(), critset.primary.begin(), critset.primary.end());
        ret.insert(ret.end(), critset.secondary.begin(),
                   critset.secondary.end());
    }
    return ret;
}